

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_equalsCString_nullptr_fn(int _i)

{
  bool bVar1;
  char *expr;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"",8);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_equalsCString(&string,(char *)0x0);
  if (bVar1 != false) {
    pcVar2 = "Assertion \'!AString_equalsCString(&string, ((void*)0))\' failed";
    iVar3 = 0x8b3;
    goto LAB_00147694;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x8b3);
  if (string.capacity == 8) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x8b4);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      string.buffer = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar2 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x8b4);
      if (string.buffer == (char *)0x0) {
        string.buffer = "(null)";
        string.size = 0x16819b;
      }
      else {
        if (*string.buffer == '\0') {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x8b4);
          if (string.size == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x8b4);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x8b5);
              bVar1 = AString_equalsCString((AString *)0x0,"");
              if (bVar1 == false) {
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x8b6);
                if (private_ACUtilsTest_AString_reallocCount != 0) {
                  string.buffer = "(0)";
                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                  pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                  pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
                  pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                  iVar3 = 0x8b7;
                  string.size = private_ACUtilsTest_AString_reallocCount;
                  goto LAB_001475ec;
                }
                _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x8b7);
                bVar1 = AString_equalsCString((AString *)0x0,(char *)0x0);
                if (bVar1 != false) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x8b8);
                  (*string.deallocator)(string.buffer);
                  return;
                }
                pcVar2 = "Assertion \'AString_equalsCString(((void*)0), ((void*)0))\' failed";
                iVar3 = 0x8b8;
              }
              else {
                pcVar2 = "Assertion \'!AString_equalsCString(((void*)0), \"\")\' failed";
                iVar3 = 0x8b6;
              }
LAB_00147694:
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,iVar3,pcVar2,0,0);
            }
            string.buffer = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
            iVar3 = 0x8b5;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_001475ec;
          }
          string.buffer = "strlen(\"\")";
          expr = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar4 = "(string).size == strlen(\"\")";
          pcVar5 = "(string).size";
          goto LAB_001475e7;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar2 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\"\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    string.buffer = "(8)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar2 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (8)";
    pcVar5 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_001475e7:
  iVar3 = 0x8b4;
LAB_001475ec:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar3,expr,pcVar2,pcVar4,pcVar5,string.size,string.buffer);
}

Assistant:

END_TEST
START_TEST(test_AString_equalsCString_nullptr)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(!AString_equalsCString(&string, nullptr));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(!AString_equalsCString(nullptr, ""));
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_equalsCString(nullptr, nullptr));
    private_ACUtilsTest_AString_destructTestString(string);
}